

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O3

void poll_cb(uv_fs_t *req)

{
  uv_handle_t *handle;
  long lVar1;
  int iVar2;
  uint64_t uVar3;
  ulong uVar4;
  
  handle = (uv_handle_t *)req[-1].statbuf.st_ctim.tv_nsec;
  iVar2 = uv_is_active(handle);
  if ((iVar2 != 0) && ((handle->flags & 3) == 0)) {
    lVar1 = req->result;
    if (lVar1 == 0) {
      iVar2 = (int)req[-1].statbuf.st_birthtim.tv_sec;
      if ((iVar2 != 0) &&
         (((((((iVar2 < 0 || (req[1].statbuf.st_uid != (req->statbuf).st_ctim.tv_nsec)) ||
              (req[1].statbuf.st_mode != (req->statbuf).st_mtim.tv_nsec)) ||
             ((req[1].statbuf.st_rdev != (req->statbuf).st_birthtim.tv_nsec ||
              (req[1].statbuf.st_nlink != (req->statbuf).st_ctim.tv_sec)))) ||
            ((req[1].statbuf.st_dev != (req->statbuf).st_mtim.tv_sec ||
             ((req[1].statbuf.st_gid != (req->statbuf).st_birthtim.tv_sec ||
              (req[1].reserved[5] != (void *)(req->statbuf).st_size)))))) ||
           (*(uint64_t *)&req[1].type != (req->statbuf).st_mode)) ||
          ((((req[1].reserved[1] != (void *)(req->statbuf).st_uid ||
             (req[1].reserved[2] != (void *)(req->statbuf).st_gid)) ||
            (req[1].reserved[4] != (void *)(req->statbuf).st_ino)) ||
           (((req[1].data != (void *)(req->statbuf).st_dev ||
             (req[1].cb != (uv_fs_cb)(req->statbuf).st_flags)) ||
            (req[1].result != (req->statbuf).st_gen)))))))) {
        (**(code **)&req[-1].file)(req[-1].statbuf.st_ctim.tv_nsec,0,req + 1);
      }
      memcpy(req + 1,&req->statbuf,0xa0);
      *(undefined4 *)&req[-1].statbuf.st_birthtim.tv_sec = 1;
    }
    else if (lVar1 != (int)req[-1].statbuf.st_birthtim.tv_sec) {
      (**(code **)&req[-1].file)(req[-1].statbuf.st_ctim.tv_nsec,lVar1,req + 1);
      *(int *)&req[-1].statbuf.st_birthtim.tv_sec = (int)req->result;
    }
  }
  uv_fs_req_cleanup(req);
  iVar2 = uv_is_active(handle);
  if ((iVar2 != 0) && ((handle->flags & 3) == 0)) {
    uVar4 = (ulong)*(uint *)((long)&req[-1].statbuf.st_birthtim.tv_sec + 4);
    uVar3 = uv_now((uv_loop_t *)req[-1].new_path);
    iVar2 = uv_timer_start((uv_timer_t *)&req[-1].mode,timer_cb,
                           uVar4 - (uVar3 - req[-1].statbuf.st_birthtim.tv_nsec) % uVar4,0);
    if (iVar2 == 0) {
      return;
    }
    abort();
  }
  uv_close((uv_handle_t *)&req[-1].mode,timer_close_cb);
  return;
}

Assistant:

static void poll_cb(uv_poll_t* handle, int status, int events) {
  char buffer[5];
  int n;
  int fd;

  ASSERT(0 == uv_fileno((uv_handle_t*)handle, &fd));
  memset(buffer, 0, 5);

  if (events & UV_PRIORITIZED) {
    do
      n = recv(client_fd, &buffer, 5, MSG_OOB);
    while (n == -1 && errno == EINTR);
    ASSERT(n >= 0 || errno != EINVAL);
    cli_pr_check = 1;
    ASSERT(0 == uv_poll_stop(&poll_req[0]));
    ASSERT(0 == uv_poll_start(&poll_req[0],
                              UV_READABLE | UV_WRITABLE,
                              poll_cb));
  }
  if (events & UV_READABLE) {
    if (fd == client_fd) {
      do
        n = recv(client_fd, &buffer, 5, 0);
      while (n == -1 && errno == EINTR);
      ASSERT(n >= 0 || errno != EINVAL);
      if (cli_rd_check == 1) {
        ASSERT(strncmp(buffer, "world", n) == 0);
        ASSERT(5 == n);
        cli_rd_check = 2;
      }
      if (cli_rd_check == 0) {
        ASSERT(n == 4);
        ASSERT(strncmp(buffer, "hello", n) == 0);
        cli_rd_check = 1;
        do {
          do
            n = recv(server_fd, &buffer, 5, 0);
          while (n == -1 && errno == EINTR);
          if (n > 0) {
            ASSERT(n == 5);
            ASSERT(strncmp(buffer, "world", n) == 0);
            cli_rd_check = 2;
          }
        } while (n > 0);

        ASSERT(got_eagain());
      }
    }
    if (fd == server_fd) {
      do
        n = recv(server_fd, &buffer, 3, 0);
      while (n == -1 && errno == EINTR);
      ASSERT(n >= 0 || errno != EINVAL);
      ASSERT(3 == n);
      ASSERT(strncmp(buffer, "foo", n) == 0);
      srv_rd_check = 1;
      uv_poll_stop(&poll_req[1]);
    }
  }
  if (events & UV_WRITABLE) {
    do {
      n = send(client_fd, "foo", 3, 0);
    } while (n < 0 && errno == EINTR);
    ASSERT(3 == n);
  }
}